

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWriter.cpp
# Opt level: O0

void __thiscall
internalJSONNode::WriteChildren(internalJSONNode *this,uint indent,json_string *output)

{
  internalJSONNode *this_00;
  bool bVar1;
  uchar uVar2;
  json_index_t jVar3;
  json_string *pjVar4;
  json_string local_d0;
  JSONNode **local_b0;
  JSONNode **it_end;
  JSONNode **it;
  size_t i;
  size_t size_minus_one;
  json_string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [8];
  json_string indent_plus_one;
  json_string *output_local;
  uint indent_local;
  internalJSONNode *this_local;
  
  indent_plus_one.field_2._8_8_ = output;
  bVar1 = jsonChildren::empty(this->Children);
  if (!bVar1) {
    std::__cxx11::string::string(local_40);
    output_local._4_4_ = indent;
    if (indent != 0xffffffff) {
      pjVar4 = jsonSingletonNEW_LINE::getValue_abi_cxx11_();
      output_local._4_4_ = indent + 1;
      makeIndent_abi_cxx11_(&local_80,output_local._4_4_);
      std::operator+(&local_60,pjVar4,&local_80);
      std::__cxx11::string::operator=(local_40,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
    }
    jVar3 = jsonChildren::size(this->Children);
    i = (size_t)(jVar3 - 1);
    it = (JSONNode **)0x0;
    it_end = jsonChildren::begin(this->Children);
    local_b0 = jsonChildren::end(this->Children);
    for (; it_end != local_b0; it_end = it_end + 1) {
      std::__cxx11::string::operator+=((string *)indent_plus_one.field_2._8_8_,local_40);
      this_00 = (*it_end)->internal;
      uVar2 = type(this);
      Write(this_00,output_local._4_4_,uVar2 == '\x04',(json_string *)indent_plus_one.field_2._8_8_)
      ;
      if (it < i) {
        std::__cxx11::string::operator+=((string *)indent_plus_one.field_2._8_8_,',');
      }
      it = (JSONNode **)((long)it + 1);
    }
    if (output_local._4_4_ != 0xffffffff) {
      pjVar4 = jsonSingletonNEW_LINE::getValue_abi_cxx11_();
      std::__cxx11::string::operator+=((string *)indent_plus_one.field_2._8_8_,(string *)pjVar4);
      makeIndent_abi_cxx11_(&local_d0,output_local._4_4_ - 1);
      std::__cxx11::string::operator+=((string *)indent_plus_one.field_2._8_8_,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void internalJSONNode::WriteChildren(unsigned int indent, json_string & output) const json_nothrow {
    //Iterate through the children and write them
    if (json_likely(CHILDREN -> empty())) return;

    json_string indent_plus_one;
    //handle whether or not it's formatted JSON
    if (indent != 0xFFFFFFFF){  //it's formatted, make the indentation strings
	   indent_plus_one = json_global(NEW_LINE) + makeIndent(++indent);
    }

    //else it's not formatted, leave the indentation strings empty
    const size_t size_minus_one = CHILDREN -> size() - 1;
    size_t i = 0;
    JSONNode ** it = CHILDREN -> begin();
    for(JSONNode ** it_end = CHILDREN -> end(); it != it_end; ++it, ++i){

		output += indent_plus_one;
		(*it) -> internal -> Write(indent, type() == JSON_ARRAY, output);
	    if (json_likely(i < size_minus_one)) output += JSON_TEXT(',');  //the last one does not get a comma, but all of the others do
    }
    if (indent != 0xFFFFFFFF){
		output += json_global(NEW_LINE);
		output += makeIndent(indent - 1);
    }
}